

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# symbol_table.cpp
# Opt level: O0

void __thiscall front::symbolTable::SymbolTable::SymbolTable(SymbolTable *this)

{
  shared_ptr<front::symbol::Symbol> *in_RDI;
  VoidSymbol *in_stack_ffffffffffffffa8;
  VoidSymbol *in_stack_fffffffffffffff0;
  
  std::
  vector<std::shared_ptr<front::symbol::Symbol>,_std::allocator<std::shared_ptr<front::symbol::Symbol>_>_>
  ::vector((vector<std::shared_ptr<front::symbol::Symbol>,_std::allocator<std::shared_ptr<front::symbol::Symbol>_>_>
            *)0x29d3f0);
  std::
  unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::shared_ptr<front::symbol::Symbol>,_std::allocator<std::shared_ptr<front::symbol::Symbol>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::shared_ptr<front::symbol::Symbol>,_std::allocator<std::shared_ptr<front::symbol::Symbol>_>_>_>_>_>
  ::unordered_map((unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::shared_ptr<front::symbol::Symbol>,_std::allocator<std::shared_ptr<front::symbol::Symbol>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::shared_ptr<front::symbol::Symbol>,_std::allocator<std::shared_ptr<front::symbol::Symbol>_>_>_>_>_>
                   *)0x29d403);
  std::shared_ptr<front::symbol::Symbol>::shared_ptr((shared_ptr<front::symbol::Symbol> *)0x29d416);
  operator_new(0x30);
  symbol::VoidSymbol::VoidSymbol(in_stack_fffffffffffffff0);
  std::shared_ptr<front::symbol::Symbol>::shared_ptr<front::symbol::VoidSymbol,void>
            (in_RDI,in_stack_ffffffffffffffa8);
  std::shared_ptr<front::symbol::Symbol>::operator=
            (in_RDI,(shared_ptr<front::symbol::Symbol> *)in_stack_ffffffffffffffa8);
  std::shared_ptr<front::symbol::Symbol>::~shared_ptr((shared_ptr<front::symbol::Symbol> *)0x29d461)
  ;
  return;
}

Assistant:

SymbolTable::SymbolTable() {
  holder_symbol = SharedSyPtr(new symbol::VoidSymbol());
}